

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindProgramCommand.cxx
# Opt level: O1

string * __thiscall
cmFindProgramCommand::FindNormalProgramDirsPerName_abi_cxx11_
          (string *__return_storage_ptr__,cmFindProgramCommand *this)

{
  pointer pbVar1;
  long *plVar2;
  string *psVar3;
  pointer pbVar4;
  pointer pbVar5;
  bool bVar6;
  bool bVar7;
  string *sp;
  string *psVar8;
  string *n;
  pointer __x;
  string *name;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  bool bVar10;
  cmFindProgramHelper helper;
  cmFindProgramHelper local_c0;
  
  cmFindProgramHelper::cmFindProgramHelper(&local_c0);
  __x = (this->super_cmFindBase).Names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->super_cmFindBase).Names.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__x != pbVar1) {
    do {
      pbVar5 = local_c0.Names.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar4 = local_c0.Names.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (local_c0.Names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_c0.Names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        paVar9 = &(local_c0.Names.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->field_2;
        do {
          plVar2 = (long *)(((string *)(paVar9 + -1))->_M_dataplus)._M_p;
          if (paVar9 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)plVar2) {
            operator_delete(plVar2,paVar9->_M_allocated_capacity + 1);
          }
          psVar8 = (string *)(paVar9 + 1);
          paVar9 = paVar9 + 2;
        } while (psVar8 != pbVar5);
        local_c0.Names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_c0.Names,__x);
      bVar6 = cmFindProgramHelper::CheckCompoundNames(&local_c0);
      if (bVar6) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,local_c0.BestPath._M_dataplus._M_p,
                   local_c0.BestPath._M_dataplus._M_p + local_c0.BestPath._M_string_length);
        goto LAB_001b0588;
      }
      psVar3 = (this->super_cmFindBase).super_cmFindCommon.SearchPaths.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (psVar8 = (this->super_cmFindBase).super_cmFindCommon.SearchPaths.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar4 = local_c0.Names.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish, bVar6 = psVar8 != psVar3,
          name = local_c0.Names.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start, bVar6; psVar8 = psVar8 + 1) {
        while ((bVar10 = name != pbVar4, bVar10 &&
               (bVar7 = cmFindProgramHelper::CheckDirectoryForName(&local_c0,psVar8,name), !bVar7)))
        {
          name = name + 1;
        }
        if (bVar10) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)__return_storage_ptr__,local_c0.BestPath._M_dataplus._M_p,
                     local_c0.BestPath._M_dataplus._M_p + local_c0.BestPath._M_string_length);
          if (bVar10) {
            if (bVar6) goto LAB_001b0588;
            break;
          }
        }
      }
      __x = __x + 1;
    } while (__x != pbVar1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
LAB_001b0588:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.TestPath._M_dataplus._M_p != &local_c0.TestPath.field_2) {
    operator_delete(local_c0.TestPath._M_dataplus._M_p,
                    local_c0.TestPath.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.TestNameExt._M_dataplus._M_p != &local_c0.TestNameExt.field_2) {
    operator_delete(local_c0.TestNameExt._M_dataplus._M_p,
                    local_c0.TestNameExt.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c0.Names);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.BestPath._M_dataplus._M_p != &local_c0.BestPath.field_2) {
    operator_delete(local_c0.BestPath._M_dataplus._M_p,
                    local_c0.BestPath.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c0.Extensions);
  return __return_storage_ptr__;
}

Assistant:

std::string cmFindProgramCommand::FindNormalProgramDirsPerName()
{
  // Search the entire path for each name.
  cmFindProgramHelper helper;
  for (std::string const& n : this->Names) {
    // Switch to searching for this name.
    helper.SetName(n);

    // Check for the names themselves if they contain a directory separator.
    if (helper.CheckCompoundNames()) {
      return helper.BestPath;
    }

    // Search every directory.
    for (std::string const& sp : this->SearchPaths) {
      if (helper.CheckDirectory(sp)) {
        return helper.BestPath;
      }
    }
  }
  // Couldn't find the program.
  return "";
}